

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx512fp16.cpp
# Opt level: O1

void ncnn::cast_fp32_to_fp16_sse_avx512fp16(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 uVar1;
  int iVar2;
  unsigned_short uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined1 (*pauVar8) [64];
  long lVar9;
  long lVar10;
  undefined1 (*pauVar11) [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  
  iVar2 = bottom_blob->c;
  if (0 < (long)iVar2) {
    uVar7 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
    lVar9 = 0;
    do {
      pauVar8 = (undefined1 (*) [64])
                (bottom_blob->cstep * lVar9 * bottom_blob->elemsize + (long)bottom_blob->data);
      pauVar11 = (undefined1 (*) [32])
                 (top_blob->cstep * lVar9 * top_blob->elemsize + (long)top_blob->data);
      if ((int)uVar7 < 0x10) {
        uVar5 = 0;
      }
      else {
        iVar4 = 0xf;
        do {
          auVar13 = vcvtps2phx_avx512fp16(*pauVar8);
          *pauVar11 = auVar13;
          pauVar8 = pauVar8 + 1;
          pauVar11 = pauVar11 + 1;
          iVar4 = iVar4 + 0x10;
          uVar5 = uVar7 & 0xfffffff0;
        } while (iVar4 < (int)uVar7);
      }
      uVar6 = uVar5 | 7;
      while ((int)uVar6 < (int)uVar7) {
        auVar12 = vcvtps2phx_avx512fp16(*(undefined1 (*) [32])*pauVar8);
        *(undefined1 (*) [16])*pauVar11 = auVar12;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
        pauVar11 = (undefined1 (*) [32])((long)*pauVar11 + 0x10);
        uVar6 = uVar5 + 0xf;
        uVar5 = uVar5 + 8;
      }
      uVar6 = uVar5 | 3;
      while ((int)uVar6 < (int)uVar7) {
        auVar12 = vcvtps2phx_avx512fp16(*(undefined1 (*) [16])*pauVar8);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = auVar12._0_8_;
        uVar1 = vmovlps_avx(auVar14);
        *(undefined8 *)*pauVar11 = uVar1;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
        pauVar11 = (undefined1 (*) [32])((long)*pauVar11 + 8);
        uVar6 = uVar5 + 7;
        uVar5 = uVar5 + 4;
      }
      if (uVar7 - uVar5 != 0 && (int)uVar5 <= (int)uVar7) {
        lVar10 = 0;
        do {
          uVar3 = float32_to_float16(*(float *)(*pauVar8 + lVar10 * 4));
          *(unsigned_short *)((long)*pauVar11 + lVar10 * 2) = uVar3;
          lVar10 = lVar10 + 1;
        } while (uVar7 - uVar5 != (int)lVar10);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar2);
  }
  return;
}

Assistant:

void cast_fp32_to_fp16_sse_avx512fp16(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
}